

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O0

void av1_calculate_ref_frame_side(AV1_COMMON *cm)

{
  uint b;
  int iVar1;
  OrderHintInfo *oh;
  long in_RDI;
  int order_hint;
  RefCntBuffer *buf;
  int ref_frame;
  int cur_order_hint;
  OrderHintInfo *order_hint_info;
  uint in_stack_ffffffffffffffdc;
  AV1_COMMON *in_stack_ffffffffffffffe0;
  int local_18;
  
  oh = (OrderHintInfo *)(*(long *)(in_RDI + 0x6088) + 0x28);
  memset((void *)(in_RDI + 0x6384),0,8);
  if (oh->enable_order_hint != 0) {
    b = *(uint *)(*(long *)(in_RDI + 0xe8) + 4);
    for (local_18 = 1; local_18 < 8; local_18 = local_18 + 1) {
      in_stack_ffffffffffffffe0 =
           (AV1_COMMON *)
           get_ref_frame_buf(in_stack_ffffffffffffffe0,
                             (MV_REFERENCE_FRAME)(in_stack_ffffffffffffffdc >> 0x18));
      in_stack_ffffffffffffffdc = 0;
      if (in_stack_ffffffffffffffe0 != (AV1_COMMON *)0x0) {
        in_stack_ffffffffffffffdc = (in_stack_ffffffffffffffe0->current_frame).order_hint;
      }
      iVar1 = get_relative_dist(oh,in_stack_ffffffffffffffdc,b);
      if (iVar1 < 1) {
        if (in_stack_ffffffffffffffdc == b) {
          *(undefined1 *)(in_RDI + 0x6384 + (long)local_18) = 0xff;
        }
      }
      else {
        *(undefined1 *)(in_RDI + 0x6384 + (long)local_18) = 1;
      }
    }
  }
  return;
}

Assistant:

void av1_calculate_ref_frame_side(AV1_COMMON *cm) {
  const OrderHintInfo *const order_hint_info = &cm->seq_params->order_hint_info;

  memset(cm->ref_frame_side, 0, sizeof(cm->ref_frame_side));
  if (!order_hint_info->enable_order_hint) return;

  const int cur_order_hint = cm->cur_frame->order_hint;

  for (int ref_frame = LAST_FRAME; ref_frame <= ALTREF_FRAME; ref_frame++) {
    const RefCntBuffer *const buf = get_ref_frame_buf(cm, ref_frame);
    int order_hint = 0;

    if (buf != NULL) order_hint = buf->order_hint;

    if (get_relative_dist(order_hint_info, order_hint, cur_order_hint) > 0)
      cm->ref_frame_side[ref_frame] = 1;
    else if (order_hint == cur_order_hint)
      cm->ref_frame_side[ref_frame] = -1;
  }
}